

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FunctionBody.cpp
# Opt level: O3

DebuggerScope * __thiscall
Js::DebuggerScope::FindCommonAncestor(DebuggerScope *this,DebuggerScope *debuggerScope)

{
  code *pcVar1;
  bool bVar2;
  DebuggerScope *currentDebuggerScope;
  DebuggerScope *pDVar3;
  DebuggerScope *pDVar4;
  DebuggerScope *pDVar5;
  undefined4 *puVar6;
  int iVar7;
  int depth_1;
  int iVar8;
  int depth;
  int iVar9;
  int iVar10;
  
  pDVar4 = debuggerScope;
  pDVar5 = this;
  if (debuggerScope == (DebuggerScope *)0x0) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar6 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    *puVar6 = 1;
    bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Base/FunctionBody.cpp"
                                ,0x17ee,"(debuggerScope)","debuggerScope");
    if (!bVar2) {
LAB_0076c5f9:
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    *puVar6 = 0;
    if (this != (DebuggerScope *)0x0) {
LAB_0076c4c2:
      while (pDVar5 != (DebuggerScope *)0x0) {
        pDVar5 = (pDVar5->parentScope).ptr;
        if (pDVar5 == debuggerScope) {
          return debuggerScope;
        }
      }
      iVar9 = 0;
      pDVar5 = this;
      do {
        pDVar5 = (pDVar5->parentScope).ptr;
        iVar9 = iVar9 + 1;
      } while (pDVar5 != (DebuggerScope *)0x0);
      iVar8 = 0;
      pDVar5 = debuggerScope;
      do {
        pDVar5 = (pDVar5->parentScope).ptr;
        iVar8 = iVar8 + 1;
      } while (pDVar5 != (DebuggerScope *)0x0);
      iVar7 = iVar9 - iVar8;
      iVar10 = -iVar7;
      if (0 < iVar7) {
        iVar10 = iVar7;
      }
      if (0 < iVar10) {
        puVar6 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
        iVar10 = iVar8 - iVar9;
        if (iVar8 - iVar9 <= iVar7) {
          iVar10 = iVar7;
        }
        iVar10 = iVar10 + 1;
        do {
          pDVar5 = debuggerScope;
          if (iVar8 < iVar9) {
            pDVar5 = this;
          }
          if (pDVar5 == (DebuggerScope *)0x0) {
            AssertCount = AssertCount + 1;
            Throw::LogAssert();
            *puVar6 = 1;
            bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Base/FunctionBody.cpp"
                                        ,0x180c,"(nodeToBringUp)","nodeToBringUp");
            if (!bVar2) goto LAB_0076c5f9;
            *puVar6 = 0;
          }
          pDVar5 = (pDVar5->parentScope).ptr;
          if (iVar9 <= iVar8) {
            debuggerScope = pDVar5;
            pDVar5 = this;
          }
          this = pDVar5;
          iVar10 = iVar10 + -1;
        } while (1 < iVar10);
      }
      pDVar4 = (DebuggerScope *)0x0;
      if ((this != (DebuggerScope *)0x0) && (debuggerScope != (DebuggerScope *)0x0)) {
        pDVar4 = this;
        while ((pDVar4 != debuggerScope &&
               (pDVar5 = (pDVar4->parentScope).ptr, pDVar4 = (DebuggerScope *)0x0,
               pDVar5 != (DebuggerScope *)0x0))) {
          debuggerScope = (debuggerScope->parentScope).ptr;
          pDVar4 = pDVar5;
          if (debuggerScope == (DebuggerScope *)0x0) {
            return (DebuggerScope *)0x0;
          }
        }
      }
    }
  }
  else {
    pDVar3 = debuggerScope;
    if (this != debuggerScope) {
      do {
        if (pDVar3 == (DebuggerScope *)0x0) goto LAB_0076c4c2;
        pDVar3 = (pDVar3->parentScope).ptr;
        pDVar4 = this;
      } while (pDVar3 != this);
    }
  }
  return pDVar4;
}

Assistant:

DebuggerScope* DebuggerScope::FindCommonAncestor(DebuggerScope* debuggerScope)
    {
        AnalysisAssert(debuggerScope);

        if (this == debuggerScope)
        {
            return debuggerScope;
        }

        if (this->IsAncestorOf(debuggerScope))
        {
            return this;
        }

        if (debuggerScope->IsAncestorOf(this))
        {
            return debuggerScope;
        }

        DebuggerScope* firstNode = this;
        DebuggerScope* secondNode = debuggerScope;

        int firstDepth = firstNode->GetScopeDepth();
        int secondDepth = secondNode->GetScopeDepth();

        // Calculate the depth difference in order to bring the deep node up to the sibling
        // level of the shorter node.
        int depthDifference = abs(firstDepth - secondDepth);

        DebuggerScope*& nodeToBringUp = firstDepth > secondDepth ? firstNode : secondNode;
        while (depthDifference > 0)
        {
            AnalysisAssert(nodeToBringUp);
            nodeToBringUp = nodeToBringUp->GetParentScope();
            --depthDifference;
        }

        // Move up the tree and see where the nodes meet.
        while (firstNode && secondNode)
        {
            if (firstNode == secondNode)
            {
                return firstNode;
            }

            firstNode = firstNode->GetParentScope();
            secondNode = secondNode->GetParentScope();
        }

        // The nodes are not part of the same scope tree.
        return nullptr;
    }